

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tcp-bind-error.c
# Opt level: O1

int run_test_tcp_bind_writable_flags(void)

{
  int iVar1;
  int extraout_EAX;
  uv_loop_t *puVar2;
  uv_loop_t *unaff_RBX;
  uv_handle_t *handle;
  int64_t eval_b_6;
  int64_t eval_b_7;
  uv_shutdown_t shutdown_req;
  sockaddr_in addr;
  uv_write_t write_req;
  uv_tcp_t server;
  undefined1 auStack_338 [16];
  undefined8 uStack_328;
  uv_tcp_t uStack_318;
  uv_loop_t *puStack_240;
  long local_230;
  long local_228;
  uv_shutdown_t local_220;
  sockaddr_in local_1c8;
  uv_write_t local_1b8;
  uv_buf_t local_f0;
  uv_tcp_t local_e0;
  
  puStack_240 = (uv_loop_t *)0x1c33c1;
  iVar1 = uv_ip4_addr("0.0.0.0",0x23a3,&local_1c8);
  local_e0.data = (void *)(long)iVar1;
  local_1b8.data = (void *)0x0;
  if (local_e0.data == (void *)0x0) {
    puStack_240 = (uv_loop_t *)0x1c33f2;
    puVar2 = uv_default_loop();
    puStack_240 = (uv_loop_t *)0x1c3402;
    iVar1 = uv_tcp_init(puVar2,&local_e0);
    local_1b8.data = (void *)(long)iVar1;
    local_220.data = (void *)0x0;
    if (local_1b8.data != (void *)0x0) goto LAB_001c368a;
    puStack_240 = (uv_loop_t *)0x1c343c;
    iVar1 = uv_tcp_bind(&local_e0,(sockaddr *)&local_1c8,0);
    local_1b8.data = (void *)(long)iVar1;
    local_220.data = (void *)0x0;
    if (local_1b8.data != (void *)0x0) goto LAB_001c369c;
    puStack_240 = (uv_loop_t *)0x1c3476;
    iVar1 = uv_listen((uv_stream_t *)&local_e0,0x80,(uv_connection_cb)0x0);
    local_1b8.data = (void *)(long)iVar1;
    local_220.data = (void *)0x0;
    if (local_1b8.data != (void *)0x0) goto LAB_001c36ae;
    puStack_240 = (uv_loop_t *)0x1c34a9;
    iVar1 = uv_is_writable((uv_stream_t *)&local_e0);
    local_1b8.data = (void *)(long)iVar1;
    local_220.data = (void *)0x0;
    if (local_1b8.data != (void *)0x0) goto LAB_001c36c0;
    puStack_240 = (uv_loop_t *)0x1c34dc;
    iVar1 = uv_is_readable((uv_stream_t *)&local_e0);
    local_1b8.data = (void *)(long)iVar1;
    local_220.data = (void *)0x0;
    if (local_1b8.data != (void *)0x0) goto LAB_001c36d2;
    puStack_240 = (uv_loop_t *)0x1c3513;
    local_f0 = uv_buf_init("PING",4);
    puStack_240 = (uv_loop_t *)0x1c3542;
    iVar1 = uv_write(&local_1b8,(uv_stream_t *)&local_e0,&local_f0,1,(uv_write_cb)0x0);
    local_220.data = (void *)(long)iVar1;
    local_230 = -0x20;
    if (local_220.data != (void *)0xffffffffffffffe0) goto LAB_001c36e4;
    puStack_240 = (uv_loop_t *)0x1c3576;
    iVar1 = uv_shutdown(&local_220,(uv_stream_t *)&local_e0,(uv_shutdown_cb)0x0);
    local_230 = (long)iVar1;
    local_228 = -0x6b;
    if (local_230 != -0x6b) goto LAB_001c36f3;
    puStack_240 = (uv_loop_t *)0x1c35ad;
    iVar1 = uv_read_start((uv_stream_t *)&local_e0,abort,abort);
    local_230 = (long)iVar1;
    local_228 = -0x6b;
    if (local_230 != -0x6b) goto LAB_001c3702;
    puStack_240 = (uv_loop_t *)0x1c35e1;
    uv_close((uv_handle_t *)&local_e0,close_cb);
    puStack_240 = (uv_loop_t *)0x1c35e6;
    puVar2 = uv_default_loop();
    puStack_240 = (uv_loop_t *)0x1c35f0;
    uv_run(puVar2,UV_RUN_DEFAULT);
    local_230 = 1;
    local_228 = (long)close_cb_called;
    if (local_228 != 1) goto LAB_001c3711;
    puStack_240 = (uv_loop_t *)0x1c361a;
    unaff_RBX = uv_default_loop();
    puStack_240 = (uv_loop_t *)0x1c362e;
    uv_walk(unaff_RBX,close_walk_cb,(void *)0x0);
    puStack_240 = (uv_loop_t *)0x1c3638;
    uv_run(unaff_RBX,UV_RUN_DEFAULT);
    local_230 = 0;
    puStack_240 = (uv_loop_t *)0x1c3646;
    puVar2 = uv_default_loop();
    puStack_240 = (uv_loop_t *)0x1c364e;
    iVar1 = uv_loop_close(puVar2);
    local_228 = (long)iVar1;
    if (local_230 == local_228) {
      puStack_240 = (uv_loop_t *)0x1c366a;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    puStack_240 = (uv_loop_t *)0x1c368a;
    run_test_tcp_bind_writable_flags_cold_1();
LAB_001c368a:
    puStack_240 = (uv_loop_t *)0x1c369c;
    run_test_tcp_bind_writable_flags_cold_2();
LAB_001c369c:
    puStack_240 = (uv_loop_t *)0x1c36ae;
    run_test_tcp_bind_writable_flags_cold_3();
LAB_001c36ae:
    puStack_240 = (uv_loop_t *)0x1c36c0;
    run_test_tcp_bind_writable_flags_cold_4();
LAB_001c36c0:
    puStack_240 = (uv_loop_t *)0x1c36d2;
    run_test_tcp_bind_writable_flags_cold_5();
LAB_001c36d2:
    puStack_240 = (uv_loop_t *)0x1c36e4;
    run_test_tcp_bind_writable_flags_cold_6();
LAB_001c36e4:
    puStack_240 = (uv_loop_t *)0x1c36f3;
    run_test_tcp_bind_writable_flags_cold_7();
LAB_001c36f3:
    puStack_240 = (uv_loop_t *)0x1c3702;
    run_test_tcp_bind_writable_flags_cold_8();
LAB_001c3702:
    puStack_240 = (uv_loop_t *)0x1c3711;
    run_test_tcp_bind_writable_flags_cold_9();
LAB_001c3711:
    puStack_240 = (uv_loop_t *)0x1c3720;
    run_test_tcp_bind_writable_flags_cold_10();
  }
  puStack_240 = (uv_loop_t *)run_test_tcp_bind_or_listen_error_after_close;
  run_test_tcp_bind_writable_flags_cold_11();
  uStack_328._0_4_ = UV_UNKNOWN_HANDLE;
  uStack_328._4_4_ = 0;
  auStack_338._8_8_ = (uv_loop_t *)0xf270002;
  puStack_240 = unaff_RBX;
  puVar2 = uv_default_loop();
  iVar1 = uv_tcp_init(puVar2,&uStack_318);
  auStack_338._0_8_ = SEXT48(iVar1);
  if ((void *)auStack_338._0_8_ == (void *)0x0) {
    uv_close((uv_handle_t *)&uStack_318,(uv_close_cb)0x0);
    iVar1 = uv_tcp_bind(&uStack_318,(sockaddr *)(auStack_338 + 8),0);
    auStack_338._0_8_ = SEXT48(iVar1);
    if ((void *)auStack_338._0_8_ != (void *)0xffffffffffffffea) goto LAB_001c3876;
    iVar1 = uv_listen((uv_stream_t *)&uStack_318,5,(uv_connection_cb)0x0);
    auStack_338._0_8_ = SEXT48(iVar1);
    if ((void *)auStack_338._0_8_ != (void *)0xffffffffffffffea) goto LAB_001c3883;
    puVar2 = uv_default_loop();
    iVar1 = uv_run(puVar2,UV_RUN_DEFAULT);
    auStack_338._0_8_ = SEXT48(iVar1);
    if ((void *)auStack_338._0_8_ == (void *)0x0) {
      puVar2 = uv_default_loop();
      uv_walk(puVar2,close_walk_cb,(void *)0x0);
      uv_run(puVar2,UV_RUN_DEFAULT);
      auStack_338._0_8_ = (void *)0x0;
      puVar2 = uv_default_loop();
      iVar1 = uv_loop_close(puVar2);
      if ((void *)auStack_338._0_8_ == (void *)(long)iVar1) {
        uv_library_shutdown();
        return 0;
      }
      goto LAB_001c389d;
    }
  }
  else {
    run_test_tcp_bind_or_listen_error_after_close_cold_1();
LAB_001c3876:
    run_test_tcp_bind_or_listen_error_after_close_cold_2();
LAB_001c3883:
    run_test_tcp_bind_or_listen_error_after_close_cold_3();
  }
  run_test_tcp_bind_or_listen_error_after_close_cold_4();
LAB_001c389d:
  handle = (uv_handle_t *)auStack_338;
  run_test_tcp_bind_or_listen_error_after_close_cold_5();
  iVar1 = uv_is_closing(handle);
  if (iVar1 != 0) {
    return iVar1;
  }
  uv_close(handle,(uv_close_cb)0x0);
  return extraout_EAX;
}

Assistant:

TEST_IMPL(tcp_bind_writable_flags) {
  struct sockaddr_in addr;
  uv_tcp_t server;
  uv_buf_t buf;
  uv_write_t write_req;
  uv_shutdown_t shutdown_req;
  int r;

  ASSERT_OK(uv_ip4_addr("0.0.0.0", TEST_PORT, &addr));
  r = uv_tcp_init(uv_default_loop(), &server);
  ASSERT_OK(r);
  r = uv_tcp_bind(&server, (const struct sockaddr*) &addr, 0);
  ASSERT_OK(r);
  r = uv_listen((uv_stream_t*)&server, 128, NULL);
  ASSERT_OK(r);

  ASSERT_OK(uv_is_writable((uv_stream_t*) &server));
  ASSERT_OK(uv_is_readable((uv_stream_t*) &server));

  buf = uv_buf_init("PING", 4);
  r = uv_write(&write_req, (uv_stream_t*) &server, &buf, 1, NULL);
  ASSERT_EQ(r, UV_EPIPE);
  r = uv_shutdown(&shutdown_req, (uv_stream_t*) &server, NULL);
  ASSERT_EQ(r, UV_ENOTCONN);
  r = uv_read_start((uv_stream_t*) &server,
                    (uv_alloc_cb) abort,
                    (uv_read_cb) abort);
  ASSERT_EQ(r, UV_ENOTCONN);

  uv_close((uv_handle_t*)&server, close_cb);

  uv_run(uv_default_loop(), UV_RUN_DEFAULT);

  ASSERT_EQ(1, close_cb_called);

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}